

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_rerolled_array_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *parent_type,string *base_expr
          ,SPIRType *type)

{
  SmallVector<unsigned_int,_8UL> *this_00;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  char cVar23;
  char cVar24;
  bool bVar25;
  uint32_t uVar26;
  SPIRType *pSVar27;
  uint uVar28;
  ulong uVar29;
  SmallVector<unsigned_int,_8UL> *pSVar30;
  uint __val;
  bool bVar31;
  string *expr;
  string __str;
  string subexpr;
  string local_210;
  SPIRType *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  SPIRType *local_1e0;
  string *local_1d8;
  string local_1d0;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 local_190 [208];
  SmallVector<unsigned_int,_8UL> local_c0;
  ImageType local_88;
  TypeID TStack_70;
  TypeID TStack_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  bVar31 = false;
  if (type->basetype == Boolean && parent_type->basetype == Struct) {
    bVar31 = (this->backend).boolean_in_struct_remapped_type != Boolean;
  }
  local_190._0_8_ = &PTR__SPIRType_0048ff28;
  local_190._8_4_ = 0;
  local_190._12_4_ = 0;
  local_190._16_4_ = Unknown;
  local_190._20_4_ = 0;
  local_190._24_4_ = 1;
  local_190._28_4_ = 1;
  this_00 = (SmallVector<unsigned_int,_8UL> *)(local_190 + 0x20);
  local_190._32_8_ = local_190 + 0x38;
  local_190._40_8_ = 0;
  local_190._48_8_ = 8;
  local_190._88_8_ = local_190 + 0x70;
  local_190._96_8_ = 0;
  local_190._104_8_ = 8;
  local_190._120_8_ = local_190._120_8_ & 0xffff000000000000;
  local_190._128_4_ = 0;
  local_190._132_4_ = 0;
  local_190._136_4_ = 0;
  local_190._140_4_ = 0;
  local_190._144_4_ = Generic;
  local_190._152_8_ = local_190 + 0xb0;
  local_190._160_8_ = 0;
  local_190._168_8_ = 8;
  local_c0.super_VectorView<unsigned_int>.ptr = (uint *)&local_c0.stack_storage;
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  local_c0.buffer_capacity = 8;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_88._0_7_ = 0;
  local_88._7_4_ = 0;
  local_88.sampled = 0;
  local_88.format = ImageFormatUnknown;
  local_88.access = AccessQualifierReadOnly;
  TStack_70.id = 0;
  TStack_6c.id = 0;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pSVar30 = this_00;
  local_1e0 = parent_type;
  local_1d8 = base_expr;
  if (bVar31) {
    pSVar27 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (type->parent_type).id);
    local_190._8_4_ = (pSVar27->super_IVariant).self.id;
    local_190._28_4_ = pSVar27->columns;
    uVar1 = *(undefined8 *)&(pSVar27->super_IVariant).field_0xc;
    uVar2 = pSVar27->width;
    uVar3 = pSVar27->vecsize;
    local_190._12_4_ = (undefined4)uVar1;
    local_190._16_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    local_190._20_4_ = uVar2;
    local_190._24_4_ = uVar3;
    SmallVector<unsigned_int,_8UL>::operator=(this_00,&pSVar27->array);
    SmallVector<bool,_8UL>::operator=
              ((SmallVector<bool,_8UL> *)(local_190 + 0x58),&pSVar27->array_size_literal);
    local_190._120_4_ = pSVar27->pointer_depth;
    local_190[0x7c] = pSVar27->pointer;
    local_190[0x7d] = pSVar27->forward_pointer;
    local_190._126_2_ = *(undefined2 *)&pSVar27->field_0x7e;
    uVar4 = (pSVar27->cooperative).use_id;
    uVar5 = (pSVar27->cooperative).rows_id;
    uVar6 = (pSVar27->cooperative).columns_id;
    uVar1 = *(undefined8 *)&(pSVar27->cooperative).scope_id;
    local_190._140_4_ = (undefined4)uVar1;
    local_190._144_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    local_190._128_4_ = uVar4;
    local_190._132_4_ = uVar5;
    local_190._136_4_ = uVar6;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)(local_190 + 0x98),
               &pSVar27->member_types);
    SmallVector<unsigned_int,_8UL>::operator=(&local_c0,&pSVar27->member_type_index_redirection);
    uVar7._0_4_ = (pSVar27->image).type;
    uVar7._4_4_ = (pSVar27->image).dim;
    uVar8._0_1_ = (pSVar27->image).depth;
    uVar8._1_1_ = (pSVar27->image).arrayed;
    uVar8._2_1_ = (pSVar27->image).ms;
    uVar8._3_1_ = (pSVar27->image).field_0xb;
    uVar8._4_4_ = (pSVar27->image).sampled;
    uVar9 = (pSVar27->image).format;
    uVar10 = (pSVar27->image).access;
    uVar11 = pSVar27->type_alias;
    uVar12 = pSVar27->parent_type;
    local_88._0_7_ = SUB87(uVar7,0);
    local_88.dim._3_1_ = (undefined1)((uint)uVar7._4_4_ >> 0x18);
    local_88._8_3_ = SUB83(uVar8,0);
    local_88._11_1_ = uVar8._3_1_;
    local_88.sampled = uVar8._4_4_;
    local_88.format = uVar9;
    local_88.access = uVar10;
    TStack_70.id = uVar11;
    TStack_6c.id = uVar12;
    if (pSVar27 != (SPIRType *)local_190) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,&(pSVar27->member_name_cache)._M_h);
    }
    local_190._16_4_ = (this->backend).boolean_in_struct_remapped_type;
    bVar31 = true;
  }
  else {
    bVar31 = false;
    if ((type->basetype == Boolean) && ((this->backend).boolean_in_struct_remapped_type != Boolean))
    {
      pSVar27 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + (type->parent_type).id);
      local_190._8_4_ = (pSVar27->super_IVariant).self.id;
      local_190._28_4_ = pSVar27->columns;
      uVar1 = *(undefined8 *)&(pSVar27->super_IVariant).field_0xc;
      uVar13 = pSVar27->width;
      uVar14 = pSVar27->vecsize;
      local_190._12_4_ = (undefined4)uVar1;
      local_190._16_4_ = (undefined4)((ulong)uVar1 >> 0x20);
      local_190._20_4_ = uVar13;
      local_190._24_4_ = uVar14;
      SmallVector<unsigned_int,_8UL>::operator=(this_00,&pSVar27->array);
      SmallVector<bool,_8UL>::operator=
                ((SmallVector<bool,_8UL> *)(local_190 + 0x58),&pSVar27->array_size_literal);
      local_190._120_4_ = pSVar27->pointer_depth;
      local_190[0x7c] = pSVar27->pointer;
      local_190[0x7d] = pSVar27->forward_pointer;
      local_190._126_2_ = *(undefined2 *)&pSVar27->field_0x7e;
      uVar15 = (pSVar27->cooperative).use_id;
      uVar16 = (pSVar27->cooperative).rows_id;
      uVar17 = (pSVar27->cooperative).columns_id;
      uVar1 = *(undefined8 *)&(pSVar27->cooperative).scope_id;
      local_190._140_4_ = (undefined4)uVar1;
      local_190._144_4_ = (undefined4)((ulong)uVar1 >> 0x20);
      local_190._128_4_ = uVar15;
      local_190._132_4_ = uVar16;
      local_190._136_4_ = uVar17;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)(local_190 + 0x98)
                 ,&pSVar27->member_types);
      SmallVector<unsigned_int,_8UL>::operator=(&local_c0,&pSVar27->member_type_index_redirection);
      uVar1._0_4_ = (pSVar27->image).type;
      uVar1._4_4_ = (pSVar27->image).dim;
      uVar18._0_1_ = (pSVar27->image).depth;
      uVar18._1_1_ = (pSVar27->image).arrayed;
      uVar18._2_1_ = (pSVar27->image).ms;
      uVar18._3_1_ = (pSVar27->image).field_0xb;
      uVar18._4_4_ = (pSVar27->image).sampled;
      uVar19 = (pSVar27->image).format;
      uVar20 = (pSVar27->image).access;
      uVar21 = pSVar27->type_alias;
      uVar22 = pSVar27->parent_type;
      local_88._0_7_ = SUB87(uVar1,0);
      local_88.dim._3_1_ = (undefined1)((uint)uVar1._4_4_ >> 0x18);
      local_88._8_3_ = SUB83(uVar18,0);
      bVar31 = true;
      local_88._11_1_ = uVar18._3_1_;
      local_88.sampled = uVar18._4_4_;
      local_88.format = uVar19;
      local_88.access = uVar20;
      TStack_70.id = uVar21;
      TStack_6c.id = uVar22;
      if (pSVar27 != (SPIRType *)local_190) {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_68,&(pSVar27->member_name_cache)._M_h);
      }
    }
  }
  uVar26 = to_array_size_literal
                     (this,type,(int)(type->array).super_VectorView<unsigned_int>.buffer_size - 1);
  local_1f0 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (type->parent_type).id);
  local_1e8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1e8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{ ","");
  if (uVar26 != 0) {
    __val = 0;
    do {
      cVar24 = '\x01';
      if (9 < __val) {
        uVar29 = (ulong)__val;
        cVar23 = '\x04';
        do {
          cVar24 = cVar23;
          uVar28 = (uint)uVar29;
          if (uVar28 < 100) {
            cVar24 = cVar24 + -2;
            goto LAB_002cce63;
          }
          if (uVar28 < 1000) {
            cVar24 = cVar24 + -1;
            goto LAB_002cce63;
          }
          if (uVar28 < 10000) goto LAB_002cce63;
          uVar29 = uVar29 / 10000;
          cVar23 = cVar24 + '\x04';
        } while (99999 < uVar28);
        cVar24 = cVar24 + '\x01';
      }
LAB_002cce63:
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_210,cVar24);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_210._M_dataplus._M_p,(uint)local_210._M_string_length,__val);
      join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_1d0,(spirv_cross *)local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3837e2,
                 (char (*) [2])&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3836e7,
                 (char (*) [2])pSVar30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      bVar25 = Compiler::is_array(&this->super_Compiler,local_1f0);
      if (bVar25) {
        to_rerolled_array_expression(&local_210,this,local_1e0,&local_1d0,local_1f0);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_210._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
        }
      }
      else {
        if (bVar31) {
          (*(this->super_Compiler)._vptr_Compiler[0x13])((spirv_cross *)local_1b0,this,local_190,0);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    (&local_210,(spirv_cross *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x398789,
                     (char (*) [2])&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,
                     (char (*) [2])pSVar30);
          ::std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p);
          }
          if (local_1b0[0] != local_1a0) {
            operator_delete(local_1b0[0]);
          }
        }
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
      }
      __val = __val + 1;
      if (__val < uVar26) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
    } while (__val != uVar26);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_190._0_8_ = &PTR__SPIRType_0048ff28;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_c0.super_VectorView<unsigned_int>.ptr !=
      &local_c0.stack_storage) {
    free(local_c0.super_VectorView<unsigned_int>.ptr);
  }
  local_190._160_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_190._152_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_190 + 0xb0)) {
    free((void *)local_190._152_8_);
  }
  local_190._96_8_ = 0;
  if ((undefined1 *)local_190._88_8_ != local_190 + 0x70) {
    free((void *)local_190._88_8_);
  }
  local_190._40_8_ = 0;
  if ((undefined1 *)local_190._32_8_ != local_190 + 0x38) {
    free((void *)local_190._32_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_rerolled_array_expression(const SPIRType &parent_type,
                                                  const string &base_expr, const SPIRType &type)
{
	bool remapped_boolean = parent_type.basetype == SPIRType::Struct &&
	                        type.basetype == SPIRType::Boolean &&
	                        backend.boolean_in_struct_remapped_type != SPIRType::Boolean;

	SPIRType tmp_type { OpNop };
	if (remapped_boolean)
	{
		tmp_type = get<SPIRType>(type.parent_type);
		tmp_type.basetype = backend.boolean_in_struct_remapped_type;
	}
	else if (type.basetype == SPIRType::Boolean && backend.boolean_in_struct_remapped_type != SPIRType::Boolean)
	{
		// It's possible that we have an r-value expression that was OpLoaded from a struct.
		// We have to reroll this and explicitly cast the input to bool, because the r-value is short.
		tmp_type = get<SPIRType>(type.parent_type);
		remapped_boolean = true;
	}

	uint32_t size = to_array_size_literal(type);
	auto &parent = get<SPIRType>(type.parent_type);
	string expr = "{ ";

	for (uint32_t i = 0; i < size; i++)
	{
		auto subexpr = join(base_expr, "[", convert_to_string(i), "]");
		if (!is_array(parent))
		{
			if (remapped_boolean)
				subexpr = join(type_to_glsl(tmp_type), "(", subexpr, ")");
			expr += subexpr;
		}
		else
			expr += to_rerolled_array_expression(parent_type, subexpr, parent);

		if (i + 1 < size)
			expr += ", ";
	}

	expr += " }";
	return expr;
}